

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_ppx *poVar2;
  OPJ_BYTE *pOVar3;
  opj_ppx *new_ppt_markers;
  OPJ_UINT32 l_newCount_1;
  OPJ_UINT32 l_newCount;
  OPJ_UINT32 l_Z_ppt;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *p_j2k_local;
  
  l_tcp = (opj_tcp_t *)0x0;
  _l_newCount = (opj_tcp_t *)0x0;
  l_cp = (opj_cp_t *)p_manager;
  p_manager_local._4_4_ = p_header_size;
  pOStack_20 = p_header_data;
  p_header_data_local = (OPJ_BYTE *)p_j2k;
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xfa2,
                  "OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xfa3,
                  "OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xfa4,
                  "OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_header_size < 2) {
    opj_event_msg(p_manager,1,"Error reading PPT marker\n");
    p_j2k_local._4_4_ = 0;
  }
  else {
    l_tcp = (opj_tcp_t *)&p_j2k->m_cp;
    if (((p_j2k->m_cp).field_0x90 & 1) == 0) {
      _l_newCount = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
      _l_newCount->field_0x1638 = _l_newCount->field_0x1638 & 0xfd | 2;
      opj_read_bytes_LE(p_header_data,&l_newCount_1,1);
      pOStack_20 = pOStack_20 + 1;
      p_manager_local._4_4_ = p_manager_local._4_4_ - 1;
      if (_l_newCount->ppt_markers == (opj_ppx *)0x0) {
        uVar1 = l_newCount_1 + 1;
        if (_l_newCount->ppt_markers_count != 0) {
          __assert_fail("l_tcp->ppt_markers_count == 0U",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                        ,0xfbd,
                        "OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                       );
        }
        poVar2 = (opj_ppx *)opj_calloc((ulong)uVar1,0x10);
        _l_newCount->ppt_markers = poVar2;
        if (_l_newCount->ppt_markers == (opj_ppx *)0x0) {
          opj_event_msg((opj_event_mgr_t *)l_cp,1,"Not enough memory to read PPT marker\n");
          return 0;
        }
        _l_newCount->ppt_markers_count = uVar1;
      }
      else if (_l_newCount->ppt_markers_count <= l_newCount_1) {
        uVar1 = l_newCount_1 + 1;
        poVar2 = (opj_ppx *)opj_realloc(_l_newCount->ppt_markers,(ulong)uVar1 << 4);
        if (poVar2 == (opj_ppx *)0x0) {
          opj_event_msg((opj_event_mgr_t *)l_cp,1,"Not enough memory to read PPT marker\n");
          return 0;
        }
        _l_newCount->ppt_markers = poVar2;
        memset(_l_newCount->ppt_markers + _l_newCount->ppt_markers_count,0,
               (ulong)(uVar1 - _l_newCount->ppt_markers_count) << 4);
        _l_newCount->ppt_markers_count = uVar1;
      }
      if (_l_newCount->ppt_markers[l_newCount_1].m_data == (OPJ_BYTE *)0x0) {
        pOVar3 = (OPJ_BYTE *)opj_malloc((ulong)p_manager_local._4_4_);
        _l_newCount->ppt_markers[l_newCount_1].m_data = pOVar3;
        if (_l_newCount->ppt_markers[l_newCount_1].m_data == (OPJ_BYTE *)0x0) {
          opj_event_msg((opj_event_mgr_t *)l_cp,1,"Not enough memory to read PPT marker\n");
          p_j2k_local._4_4_ = 0;
        }
        else {
          _l_newCount->ppt_markers[l_newCount_1].m_data_size = p_manager_local._4_4_;
          memcpy(_l_newCount->ppt_markers[l_newCount_1].m_data,pOStack_20,
                 (ulong)p_manager_local._4_4_);
          p_j2k_local._4_4_ = 1;
        }
      }
      else {
        opj_event_msg((opj_event_mgr_t *)l_cp,1,"Zppt %u already read\n",(ulong)l_newCount_1);
        p_j2k_local._4_4_ = 0;
      }
    }
    else {
      opj_event_msg(p_manager,1,
                    "Error reading PPT marker: packet header have been previously found in the main header (PPM marker).\n"
                   );
      p_j2k_local._4_4_ = 0;
    }
  }
  return p_j2k_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    OPJ_UINT32 l_Z_ppt;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    /* We need to have the Z_ppt element + 1 byte of Ippt at minimum */
    if (p_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading PPT marker\n");
        return OPJ_FALSE;
    }

    l_cp = &(p_j2k->m_cp);
    if (l_cp->ppm) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Error reading PPT marker: packet header have been previously found in the main header (PPM marker).\n");
        return OPJ_FALSE;
    }

    l_tcp = &(l_cp->tcps[p_j2k->m_current_tile_number]);
    l_tcp->ppt = 1;

    opj_read_bytes(p_header_data, &l_Z_ppt, 1);             /* Z_ppt */
    ++p_header_data;
    --p_header_size;

    /* check allocation needed */
    if (l_tcp->ppt_markers == NULL) { /* first PPT marker */
        OPJ_UINT32 l_newCount = l_Z_ppt + 1U; /* can't overflow, l_Z_ppt is UINT8 */
        assert(l_tcp->ppt_markers_count == 0U);

        l_tcp->ppt_markers = (opj_ppx *) opj_calloc(l_newCount, sizeof(opj_ppx));
        if (l_tcp->ppt_markers == NULL) {
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPT marker\n");
            return OPJ_FALSE;
        }
        l_tcp->ppt_markers_count = l_newCount;
    } else if (l_tcp->ppt_markers_count <= l_Z_ppt) {
        OPJ_UINT32 l_newCount = l_Z_ppt + 1U; /* can't overflow, l_Z_ppt is UINT8 */
        opj_ppx *new_ppt_markers;
        new_ppt_markers = (opj_ppx *) opj_realloc(l_tcp->ppt_markers,
                          l_newCount * sizeof(opj_ppx));
        if (new_ppt_markers == NULL) {
            /* clean up to be done on l_tcp destruction */
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPT marker\n");
            return OPJ_FALSE;
        }
        l_tcp->ppt_markers = new_ppt_markers;
        memset(l_tcp->ppt_markers + l_tcp->ppt_markers_count, 0,
               (l_newCount - l_tcp->ppt_markers_count) * sizeof(opj_ppx));
        l_tcp->ppt_markers_count = l_newCount;
    }

    if (l_tcp->ppt_markers[l_Z_ppt].m_data != NULL) {
        /* clean up to be done on l_tcp destruction */
        opj_event_msg(p_manager, EVT_ERROR, "Zppt %u already read\n", l_Z_ppt);
        return OPJ_FALSE;
    }

    l_tcp->ppt_markers[l_Z_ppt].m_data = (OPJ_BYTE *) opj_malloc(p_header_size);
    if (l_tcp->ppt_markers[l_Z_ppt].m_data == NULL) {
        /* clean up to be done on l_tcp destruction */
        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPT marker\n");
        return OPJ_FALSE;
    }
    l_tcp->ppt_markers[l_Z_ppt].m_data_size = p_header_size;
    memcpy(l_tcp->ppt_markers[l_Z_ppt].m_data, p_header_data, p_header_size);
    return OPJ_TRUE;
}